

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

void Rwt_ManLoadFromArray(Rwt_Man_t *p,int fVerbose)

{
  ushort uVar1;
  void **ppvVar2;
  Rwt_Node_t *p0;
  Rwt_Node_t *p1;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int level;
  ushort *puVar10;
  timespec ts;
  long local_58;
  timespec local_48;
  ulong local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_58 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  uVar3 = 8;
  uVar6 = 2;
  uVar9 = 0xffffffff;
  puVar10 = s_RwtAigSubgraphs + 3;
  do {
    local_38 = (ulong)(uVar3 & 1);
    ppvVar2 = p->vForest->pArray;
    p0 = *(Rwt_Node_t **)((long)ppvVar2 + (ulong)(uVar3 & 0xfffffffc) * 2);
    p1 = *(Rwt_Node_t **)((long)ppvVar2 + (ulong)(uVar6 & 0xfffffffe) * 4);
    uVar5 = (byte)p0->field_0xb & 0x3f;
    uVar8 = (byte)p1->field_0xb & 0x3f;
    if (uVar8 < uVar5) {
      uVar8 = uVar5;
    }
    iVar4 = Rwt_ManNodeVolume(p,p0,p1);
    Rwt_ManAddNode(p,(Rwt_Node_t *)((ulong)(uVar3 >> 1 & 1) ^ (ulong)p0),
                   (Rwt_Node_t *)((ulong)(uVar6 & 1) ^ (ulong)p1),(int)local_38,uVar8 + 1,
                   (int)local_38 + iVar4 + 1);
    uVar3 = puVar10[-1];
    uVar1 = *puVar10;
    uVar6 = (uint)uVar1;
    uVar9 = uVar9 + 1;
    puVar10 = puVar10 + 2;
  } while (uVar1 != 0 || uVar3 != 0);
  if (fVerbose != 0) {
    printf("The number of classes = %d. Canonical nodes = %d.\n",(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nAdded);
    iVar4 = 0x9e9b00;
    printf("The number of nodes loaded = %d.  ",(ulong)uVar9);
    Abc_Print(iVar4,"%s =","Loading");
    level = 3;
    iVar4 = clock_gettime(3,&local_48);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + local_58) / 1000000.0);
  }
  return;
}

Assistant:

void Rwt_ManLoadFromArray( Rwt_Man_t * p, int fVerbose )
{
    unsigned short * pArray = s_RwtAigSubgraphs;
    Rwt_Node_t * p0, * p1;
    unsigned Entry0, Entry1;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();

    // reconstruct the forest
    for ( i = 0; ; i++ )
    {
        Entry0 = pArray[2*i + 0];
        Entry1 = pArray[2*i + 1];
        if ( Entry0 == 0 && Entry1 == 0 )
            break;
        // get EXOR flag
        fExor = (Entry0 & 1);
        Entry0 >>= 1;
        // get the nodes
        p0 = (Rwt_Node_t *)p->vForest->pArray[Entry0 >> 1];
        p1 = (Rwt_Node_t *)p->vForest->pArray[Entry1 >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + RWT_MAX( p0->Level, p1->Level );
        Volume = 1 + Rwt_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwt_NotCond( p0, (Entry0 & 1) );
        p1 = Rwt_NotCond( p1, (Entry1 & 1) );
        // add the node
//        Rwt_ManTryNode( p, p0, p1, Level, Volume );
        Rwt_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    nEntries = i - 1;
    if ( fVerbose )
    {
        printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
        printf( "The number of nodes loaded = %d.  ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
    }
}